

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::ToEnumCase(string *input)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RSI;
  string *in_RDI;
  int i;
  string *result;
  undefined4 local_28;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_28 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_28 < uVar1;
      local_28 = local_28 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    if ((*pcVar2 < 'a') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), 'z' < *pcVar2)) {
      std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::push_back((char)in_RDI);
    }
    else {
      std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::string ToEnumCase(const std::string& input) {
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      result.push_back(input[i] - 'a' + 'A');
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}